

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  ostream *poVar1;
  
  if ((this->super_StreamingReporterBase).currentGroupInfo.used == true) {
    printSummaryDivider(this);
    poVar1 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Summary for group \'",0x13);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(_testGroupStats->groupInfo).name._M_dataplus._M_p,
                        (_testGroupStats->groupInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\':\n",3);
    printTotals(this,&_testGroupStats->totals);
    poVar1 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( currentGroupInfo.used ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }